

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

TypeId __thiscall
Js::JavascriptNativeIntArray::TrySetNativeIntArrayItem
          (JavascriptNativeIntArray *this,Var value,int32 *iValue,double *dValue)

{
  bool bVar1;
  double value_00;
  int local_30;
  bool local_29;
  int32 i;
  bool isInt32;
  
  bVar1 = TaggedInt::Is(value);
  if (bVar1) {
    local_30 = TaggedInt::ToInt32(value);
    if (local_30 != -0x7fffe) {
LAB_00a43cbc:
      *iValue = local_30;
      return TypeIds_NativeIntArray;
    }
  }
  else if ((ulong)value >> 0x32 != 0) {
    value_00 = JavascriptNumber::GetValue(value);
    bVar1 = JavascriptNumber::TryGetInt32OrUInt32Value(value_00,&local_30,&local_29);
    if (!bVar1) {
      *dValue = value_00;
      ToNativeFloatArray(this);
      return TypeIds_ArrayLast;
    }
    if ((local_30 != -0x7fffe & local_29) == 1) goto LAB_00a43cbc;
  }
  ToVarArray(this);
  return TypeIds_Array;
}

Assistant:

TypeId JavascriptNativeIntArray::TrySetNativeIntArrayItem(Var value, int32 *iValue, double *dValue)
    {
        if (TaggedInt::Is(value))
        {
            int32 i = TaggedInt::ToInt32(value);
            if (i != JavascriptNativeIntArray::MissingItem)
            {
                *iValue = i;
                return TypeIds_NativeIntArray;
            }
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(value))
        {
            bool isInt32;
            int32 i;
            double d = JavascriptNumber::GetValue(value);
            if (JavascriptNumber::TryGetInt32OrUInt32Value(d, &i, &isInt32))
            {
                if (isInt32 && i != JavascriptNativeIntArray::MissingItem)
                {
                    *iValue = i;
                    return TypeIds_NativeIntArray;
                }
            }
            else
            {
                *dValue = d;
                JavascriptNativeIntArray::ToNativeFloatArray(this);
                return TypeIds_NativeFloatArray;
            }
        }

        JavascriptNativeIntArray::ToVarArray(this);
        return TypeIds_Array;
    }